

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

Clifford * operator-(Clifford *__return_storage_ptr__,Clifford *A,float tv)

{
  Clifford R;
  Blade local_60;
  vector<Blade,_std::allocator<Blade>_> local_58;
  vector<Blade,_std::allocator<Blade>_> local_40;
  vector<Blade,_std::allocator<Blade>_> local_28;
  
  local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Blade *)0x0;
  local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Blade *)0x0;
  Blade::Blade(&local_60,0,-tv);
  if (local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
              (&local_58,
               (iterator)
               local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_60);
  }
  else {
    *local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_60;
    local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  Blade::~Blade(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_28,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_40,&local_58);
  operator+(__return_storage_ptr__,&local_28,&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator-(Clifford A,float tv)
{
	Clifford R;R.push_back(Blade(0,-1*tv));
	return (A+R);
}